

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O0

MPP_RET hal_jpege_vepu_rc(HalJpegeCtx *ctx,HalEncTask *task)

{
  int iVar1;
  EncRcTask *pEVar2;
  short sVar3;
  short sVar4;
  RK_U8 RVar5;
  HalJpegeRc *pHVar6;
  int local_30;
  RK_S16 cq;
  RK_S16 lq;
  RK_S32 q;
  RK_U32 i;
  EncRcTaskInfo *rc_info;
  HalJpegeRc *hal_rc;
  HalEncTask *task_local;
  HalJpegeCtx *ctx_local;
  
  pHVar6 = &ctx->hal_rc;
  pEVar2 = task->rc_task;
  if ((pEVar2->info).quality_target != (ctx->hal_rc).last_quality) {
    pHVar6->q_factor = 100 - (pEVar2->info).quality_target;
    if ((hal_jpege_debug & 0x10) != 0) {
      _mpp_log_l(4,"hal_jpege_base","use qfactor=%d, rc_info->quality_target=%d\n",(char *)0x0,
                 (ulong)(uint)pHVar6->q_factor,(ulong)(uint)(pEVar2->info).quality_target);
    }
    iVar1 = pHVar6->q_factor;
    if (iVar1 < 0x32) {
      local_30 = (int)(5000 / (long)iVar1);
    }
    else {
      local_30 = iVar1 * -2 + 200;
    }
    for (_cq = 0; _cq < 0x40; _cq = _cq + 1) {
      sVar3 = (short)((int)((uint)"\x10\v\n\x10\x18(3=\f\f\x0e\x13\x1a:<7\x0e\r\x10\x18(9E8\x0e\x11\x16\x1d3WP>\x12\x16%8DmgM\x18#7@Qhq\\1@NWgyxeH\\_bpdgc"
                                  [_cq] * local_30 + 0x32) / 100);
      sVar4 = (short)((int)((uint)"\x11\x12\x18/cccc\x12\x15\x1aBcccc\x18\x1a8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                                  [_cq] * local_30 + 0x32) / 100);
      if (sVar3 < 1) {
        RVar5 = '\x01';
      }
      else {
        if (0xff < sVar3) {
          sVar3 = 0xff;
        }
        RVar5 = (RK_U8)sVar3;
      }
      (ctx->hal_rc).qtable_y[_cq] = RVar5;
      if (sVar4 < 1) {
        RVar5 = '\x01';
      }
      else {
        if (0xff < sVar4) {
          sVar4 = 0xff;
        }
        RVar5 = (RK_U8)sVar4;
      }
      (ctx->hal_rc).qtable_c[_cq] = RVar5;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu_rc(HalJpegeCtx *ctx, HalEncTask *task)
{
    HalJpegeRc *hal_rc = &ctx->hal_rc;
    EncRcTaskInfo *rc_info = (EncRcTaskInfo *)&task->rc_task->info;

    if (rc_info->quality_target != hal_rc->last_quality) {
        RK_U32 i = 0;
        RK_S32 q = 0;

        hal_rc->q_factor = 100 - rc_info->quality_target;
        hal_jpege_dbg_input("use qfactor=%d, rc_info->quality_target=%d\n", hal_rc->q_factor, rc_info->quality_target);

        q = hal_rc->q_factor;
        if (q < 50)
            q = 5000 / q;
        else
            q = 200 - (q << 1);

        for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
            RK_S16 lq = (jpege_luma_quantizer[i] * q + 50) / 100;
            RK_S16 cq = (jpege_chroma_quantizer[i] * q + 50) / 100;

            /* Limit the quantizers to 1 <= q <= 255 */
            hal_rc->qtable_y[i] = MPP_CLIP3(1, 255, lq);
            hal_rc->qtable_c[i] = MPP_CLIP3(1, 255, cq);
        }
    }

    return MPP_OK;
}